

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.h
# Opt level: O0

void __thiscall FPortalBlockmap::Clear(FPortalBlockmap *this)

{
  FPortalBlockmap *this_local;
  
  TArray<FPortalBlock,_FPortalBlock>::Clear(&this->data);
  TArray<FPortalBlock,_FPortalBlock>::ShrinkToFit(&this->data);
  this->dy = 0;
  this->dx = 0;
  this->containsLines = false;
  this->hasLinkedPolyPortals = false;
  this->hasLinkedSectorPortals = false;
  return;
}

Assistant:

void Clear()
	{
		data.Clear();
		data.ShrinkToFit();
		dx = dy = 0;
		containsLines = false;
		hasLinkedPolyPortals = false;
		hasLinkedSectorPortals = false;
	}